

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O1

int __thiscall deqp::gles31::Functional::UniformCase::init(UniformCase *this,EVP_PKEY_CTX *ctx)

{
  UniformCollection *pUVar1;
  pointer pUVar2;
  int iVar3;
  undefined4 extraout_var;
  NotSupportedError *pNVar5;
  long *plVar6;
  size_type *psVar7;
  uint uVar8;
  ulong uVar9;
  VarType *type;
  int fragmentTexUnitsSupported;
  int vertexTexUnitsSupported;
  int combinedTexUnitsRequired;
  int fragmentTexUnitsRequired;
  int vertexTexUnitsRequired;
  int val;
  int combinedTexUnitsSupported;
  int local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  int local_94;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  long lVar4;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar3);
  pUVar1 = (this->m_uniformCollection).m_ptr;
  pUVar2 = (pUVar1->m_uniforms).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = (int)((long)(pUVar1->m_uniforms).
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar2 >> 3) * -0x49249249;
  local_e0 = 0;
  if (0 < (int)uVar8) {
    uVar9 = (ulong)(uVar8 & 0x7fffffff);
    type = &pUVar2->type;
    local_e0 = 0;
    do {
      iVar3 = getNumSamplersInType(type);
      local_e0 = local_e0 + iVar3;
      type = (VarType *)&type[2].m_data;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  local_dc = 0;
  if (this->m_caseShaderType != CASESHADERTYPE_FRAGMENT) {
    local_dc = local_e0;
  }
  if (this->m_caseShaderType == CASESHADERTYPE_VERTEX) {
    local_e0 = 0;
  }
  local_e4 = local_e0 + local_dc;
  local_b8._M_dataplus._M_p._0_4_ = -1;
  (**(code **)(lVar4 + 0x868))(0x8b4c,&local_b8);
  local_e8 = (int)local_b8._M_dataplus._M_p;
  local_b8._M_dataplus._M_p._0_4_ = -1;
  (**(code **)(lVar4 + 0x868))(0x8872,&local_b8);
  local_ec = (int)local_b8._M_dataplus._M_p;
  local_b8._M_dataplus._M_p._0_4_ = 0xffffffff;
  (**(code **)(lVar4 + 0x868))(0x8b4d,&local_b8);
  local_94 = (int)local_b8._M_dataplus._M_p;
  if (local_e8 < local_dc) {
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    de::toString<int>(&local_70,&local_dc);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_d8._M_dataplus._M_p = (pointer)*plVar6;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_d8._M_dataplus._M_p == psVar7) {
      local_d8.field_2._M_allocated_capacity = *psVar7;
      local_d8.field_2._8_8_ = plVar6[3];
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    }
    else {
      local_d8.field_2._M_allocated_capacity = *psVar7;
    }
    local_d8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    de::toString<int>(&local_90,&local_e8);
    std::operator+(&local_50,&local_d8,&local_90);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_b8._M_dataplus._M_p = (pointer)*plVar6;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_b8._M_dataplus._M_p == psVar7) {
      local_b8.field_2._M_allocated_capacity = *psVar7;
      local_b8.field_2._8_8_ = plVar6[3];
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    }
    else {
      local_b8.field_2._M_allocated_capacity = *psVar7;
    }
    local_b8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    tcu::NotSupportedError::NotSupportedError(pNVar5,&local_b8);
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (local_ec < local_e0) {
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    de::toString<int>(&local_70,&local_e0);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_d8._M_dataplus._M_p = (pointer)*plVar6;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_d8._M_dataplus._M_p == psVar7) {
      local_d8.field_2._M_allocated_capacity = *psVar7;
      local_d8.field_2._8_8_ = plVar6[3];
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    }
    else {
      local_d8.field_2._M_allocated_capacity = *psVar7;
    }
    local_d8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    de::toString<int>(&local_90,&local_ec);
    std::operator+(&local_50,&local_d8,&local_90);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_b8._M_dataplus._M_p = (pointer)*plVar6;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((size_type *)local_b8._M_dataplus._M_p == psVar7) {
      local_b8.field_2._M_allocated_capacity = *psVar7;
      local_b8.field_2._8_8_ = plVar6[3];
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    }
    else {
      local_b8.field_2._M_allocated_capacity = *psVar7;
    }
    local_b8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    tcu::NotSupportedError::NotSupportedError(pNVar5,&local_b8);
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (local_e4 <= (int)local_b8._M_dataplus._M_p) {
    (this->super_CallLogWrapper).m_enableLog = true;
    return (int)local_b8._M_dataplus._M_p;
  }
  pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  de::toString<int>(&local_70,&local_e4);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_d8._M_dataplus._M_p = (pointer)*plVar6;
  psVar7 = (size_type *)(plVar6 + 2);
  if ((size_type *)local_d8._M_dataplus._M_p == psVar7) {
    local_d8.field_2._M_allocated_capacity = *psVar7;
    local_d8.field_2._8_8_ = plVar6[3];
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  }
  else {
    local_d8.field_2._M_allocated_capacity = *psVar7;
  }
  local_d8._M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  de::toString<int>(&local_90,&local_94);
  std::operator+(&local_50,&local_d8,&local_90);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_b8._M_dataplus._M_p = (pointer)*plVar6;
  psVar7 = (size_type *)(plVar6 + 2);
  if ((size_type *)local_b8._M_dataplus._M_p == psVar7) {
    local_b8.field_2._M_allocated_capacity = *psVar7;
    local_b8.field_2._8_8_ = plVar6[3];
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  }
  else {
    local_b8.field_2._M_allocated_capacity = *psVar7;
  }
  local_b8._M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  tcu::NotSupportedError::NotSupportedError(pNVar5,&local_b8);
  __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void UniformCase::init (void)
{
	{
		const glw::Functions&	funcs						= m_context.getRenderContext().getFunctions();
		const int				numSamplerUniforms			= m_uniformCollection->getNumSamplers();
		const int				vertexTexUnitsRequired		= m_caseShaderType != CASESHADERTYPE_FRAGMENT ? numSamplerUniforms : 0;
		const int				fragmentTexUnitsRequired	= m_caseShaderType != CASESHADERTYPE_VERTEX ? numSamplerUniforms : 0;
		const int				combinedTexUnitsRequired	= vertexTexUnitsRequired + fragmentTexUnitsRequired;
		const int				vertexTexUnitsSupported		= getGLInt(funcs, GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS);
		const int				fragmentTexUnitsSupported	= getGLInt(funcs, GL_MAX_TEXTURE_IMAGE_UNITS);
		const int				combinedTexUnitsSupported	= getGLInt(funcs, GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS);

		DE_ASSERT(numSamplerUniforms <= MAX_NUM_SAMPLER_UNIFORMS);

		if (vertexTexUnitsRequired > vertexTexUnitsSupported)
			throw tcu::NotSupportedError(de::toString(vertexTexUnitsRequired) + " vertex texture units required, " + de::toString(vertexTexUnitsSupported) + " supported");
		if (fragmentTexUnitsRequired > fragmentTexUnitsSupported)
			throw tcu::NotSupportedError(de::toString(fragmentTexUnitsRequired) + " fragment texture units required, " + de::toString(fragmentTexUnitsSupported) + " supported");
		if (combinedTexUnitsRequired > combinedTexUnitsSupported)
			throw tcu::NotSupportedError(de::toString(combinedTexUnitsRequired) + " combined texture units required, " + de::toString(combinedTexUnitsSupported) + " supported");
	}

	enableLogging(true);
}